

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O2

Hop_Obj_t * Abc_MfsConvertAigToHop(Aig_Man_t *pMan,Hop_Man_t *pHop)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  Hop_Obj_t *pHVar3;
  Aig_Obj_t *pAVar4;
  Hop_Obj_t **ppHVar5;
  int i;
  
  if (pMan->nObjs[3] == 1) {
    i = 0;
    pAVar1 = Aig_ManCo(pMan,0);
    pAVar4 = pAVar1->pFanin0;
    if ((*(uint *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18) & 7) == 1) {
      ppHVar5 = &pHop->pConst1;
    }
    else {
      Aig_ManCleanData(pMan);
      for (; i < pMan->vCis->nSize; i = i + 1) {
        pvVar2 = Vec_PtrEntry(pMan->vCis,i);
        pHVar3 = Hop_IthVar(pHop,i);
        *(Hop_Obj_t **)((long)pvVar2 + 0x28) = pHVar3;
      }
      Abc_MfsConvertAigToHop_rec((Aig_Obj_t *)((ulong)pAVar1->pFanin0 & 0xfffffffffffffffe),pHop);
      pAVar4 = pAVar1->pFanin0;
      ppHVar5 = (Hop_Obj_t **)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x28);
    }
    return (Hop_Obj_t *)((ulong)((uint)pAVar4 & 1) ^ (ulong)*ppHVar5);
  }
  __assert_fail("Aig_ManCoNum(pMan) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsStrash.c"
                ,0x47,"Hop_Obj_t *Abc_MfsConvertAigToHop(Aig_Man_t *, Hop_Man_t *)");
}

Assistant:

Hop_Obj_t * Abc_MfsConvertAigToHop( Aig_Man_t * pMan, Hop_Man_t * pHop )
{
    Aig_Obj_t * pRoot, * pObj;
    int i;
    assert( Aig_ManCoNum(pMan) == 1 );
    pRoot = Aig_ManCo( pMan, 0 );
    // check the case of a constant
    if ( Aig_ObjIsConst1( Aig_ObjFanin0(pRoot) ) )
        return Hop_NotCond( Hop_ManConst1(pHop), Aig_ObjFaninC0(pRoot) );
    // set the PI mapping
    Aig_ManCleanData( pMan );
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pData = Hop_IthVar( pHop, i );
    // construct the AIG
    Abc_MfsConvertAigToHop_rec( Aig_ObjFanin0(pRoot), pHop );
    return Hop_NotCond( (Hop_Obj_t *)Aig_ObjFanin0(pRoot)->pData, Aig_ObjFaninC0(pRoot) );
}